

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

ostream * mat_lib::operator<<(ostream *os,vector<double> *vector)

{
  ostream *poVar1;
  ulong uVar2;
  code *pcVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"mat_lib::vector[",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]{",2);
  poVar1 = os;
  if ((vector->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (vector->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (vector->format__ == fixed) {
      pcVar3 = std::fixed;
    }
    else {
      pcVar3 = std::scientific;
    }
    uVar2 = vector->max_size__ - 1;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        (*pcVar3)(os + *(long *)(*(long *)os + -0x18));
        *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = (long)vector->fractional_digits__;
        poVar1 = std::ostream::_M_insert<double>
                           ((vector->container__).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        uVar4 = uVar4 + 1;
        uVar2 = vector->max_size__ - 1;
      } while (uVar4 < uVar2);
    }
    poVar1 = std::ostream::_M_insert<double>
                       ((vector->container__).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar2]);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector &vector) {
          os << "mat_lib::vector[" << vector.size() << "]{";

          if(vector.is_empty()){
             os << "}";
             return os;
          }

          auto formatter = vector.getFormat() == mat_lib::fixed ? std::fixed : std::scientific;
          for(int i = 0 ; i < vector.size()-1; i++)
          {
              os << formatter << setprecision(vector.getFractionalDigits()) << vector[i] << ", ";
          }
          os<< vector[vector.size()-1] << "}";
          return os;
      }